

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O0

void __thiscall
covenant::CFG::get_stats(CFG *this,uint *terminals,uint *nonterminals,uint *productions)

{
  size_type sVar1;
  const_reference this_00;
  int *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  uint vv;
  undefined4 local_24;
  
  *in_RSI = *(undefined4 *)(in_RDI + 0x30);
  sVar1 = std::
          vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
          ::size((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                  *)(in_RDI + 0x40));
  *in_RDX = (int)sVar1;
  *in_RCX = 0;
  local_24 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
            ::size((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                    *)(in_RDI + 0x40));
    if (sVar1 <= local_24) break;
    this_00 = std::
              vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
              ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                            *)(in_RDI + 0x40),(ulong)local_24);
    sVar1 = std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::size
                      (this_00);
    *in_RCX = *in_RCX + (int)sVar1;
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void get_stats(unsigned& terminals,
                   unsigned& nonterminals,
                   unsigned& productions) const
    {
      terminals = alphsz;
      nonterminals = prods.size ();
      productions = 0;
      for ( unsigned vv = 0; vv < prods.size(); ++vv)
        productions += prods[vv].size();
    }